

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app_test.cpp
# Opt level: O2

void __thiscall
ot::commissioner::PskdTest_Pskdvalidation_GoodPskdShouldBeAccepted_Test::TestBody
          (PskdTest_Pskdvalidation_GoodPskdShouldBeAccepted_Test *this)

{
  element_type *peVar1;
  char *pcVar2;
  allocator local_1a9;
  undefined1 local_1a8 [8];
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  AssertHelper local_148;
  undefined8 local_140;
  undefined1 local_138 [16];
  shared_ptr<ot::commissioner::CommissionerApp> commApp;
  ErrorCode local_10c;
  Config config;
  
  Config::Config(&config);
  config.mEnableCcm = false;
  local_1a8._0_4_ = 0x33221100;
  local_1a8._4_4_ = 0x77665544;
  uStack_1a0 = 0xbbaa9988;
  uStack_19c = 0xffeeddcc;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&config.mPSKc,local_1a8);
  commApp.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  commApp.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  CommissionerAppCreate((Error *)local_1a8,&commApp,&config);
  local_148.data_ = (AssertHelperData *)((ulong)local_148.data_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)&gtest_ar,"CommissionerAppCreate(commApp, config)","ErrorCode::kNone",
             (Error *)local_1a8,(ErrorCode *)&local_148);
  std::__cxx11::string::~string((string *)&uStack_1a0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_1a8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = anon_var_dwarf_4657bc + 9;
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/commissioner_app_test.cpp"
               ,0x6f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_148,(Message *)local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    if ((long *)CONCAT44(local_1a8._4_4_,local_1a8._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_1a8._4_4_,local_1a8._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  peVar1 = commApp.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  std::__cxx11::string::string((string *)&gtest_ar,"PSKD01",&local_1a9);
  local_148.data_ = (AssertHelperData *)local_138;
  local_140 = 0;
  local_138[0] = kSuccess;
  (*(peVar1->super_CommissionerHandler)._vptr_CommissionerHandler[0x15])
            (local_1a8,peVar1,0,0x11223344556677,&gtest_ar,&local_148);
  local_10c = 2;
  testing::internal::CmpHelperNE<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)&gtest_ar_1,
             "commApp->EnableJoiner(JoinerType::kMeshCoP, eui64, \"PSKD01\")",
             "ErrorCode::kInvalidArgs",(Error *)local_1a8,&local_10c);
  std::__cxx11::string::~string((string *)&uStack_1a0);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)local_1a8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = anon_var_dwarf_4657bc + 9;
    }
    else {
      pcVar2 = *(char **)gtest_ar_1.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/commissioner_app_test.cpp"
               ,0x73,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    if ((long *)CONCAT44(local_1a8._4_4_,local_1a8._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_1a8._4_4_,local_1a8._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_1.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&commApp.
              super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  Config::~Config(&config);
  return;
}

Assistant:

TEST(PskdTest, Pskdvalidation_GoodPskdShouldBeAccepted)
{
    Config config;
    config.mEnableCcm = false;
    config.mPSKc = {0x00, 0x11, 0x22, 0x33, 0x44, 0x55, 0x66, 0x77, 0x88, 0x99, 0xaa, 0xbb, 0xcc, 0xdd, 0xee, 0xff};

    std::shared_ptr<CommissionerApp> commApp;
    EXPECT_EQ(CommissionerAppCreate(commApp, config), ErrorCode::kNone);

    constexpr uint64_t eui64 = 0x0011223344556677;

    EXPECT_NE(commApp->EnableJoiner(JoinerType::kMeshCoP, eui64, "PSKD01"), ErrorCode::kInvalidArgs);
}